

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O2

void parallel_for_1d(thread_pool *thread_pool,_func_void_parallel_task_1d_ptr_size_t *compute,
                    parallel_task_1d *init,size_t task_size,range *range)

{
  size_t count;
  size_t task_count;
  work_item *tasks;
  ulong uVar1;
  work_item *last;
  work_item *first;
  work_item *pwVar2;
  work_item *last_00;
  work_item *pwVar3;
  
  count = thread_pool->thread_count;
  task_count = count * 2;
  tasks = (work_item *)xmalloc(task_count * task_size);
  init_parallel_tasks(tasks,&init->work_item,(_func_void_work_item_ptr_size_t *)compute,task_size,
                      task_count);
  pwVar3 = (work_item *)range->begin;
  pwVar2 = (work_item *)range->end;
  uVar1 = (long)pwVar2 - (long)pwVar3;
  last = (work_item *)0x0;
  last_00 = tasks;
  first = tasks;
  while( true ) {
    if (pwVar2 <= pwVar3) {
      if (last != (work_item *)0x0) {
        last->next = (work_item *)0x0;
        submit_work(thread_pool,first,last);
      }
      wait_for_completion(thread_pool,0);
      free(tasks);
      return;
    }
    if (last_00 == (work_item *)0x0) break;
    last_00[1].work_fn = (work_fn_t)pwVar3;
    pwVar3 = (work_item *)
             ((long)pwVar3 + ((uVar1 / task_count + 1) - (ulong)(uVar1 % task_count == 0)));
    if (pwVar3 < pwVar2) {
      pwVar2 = pwVar3;
    }
    last_00[1].next = pwVar2;
    last = last_00;
    pwVar2 = last_00->next;
    if (last_00->next == (work_item *)0x0) {
      submit_work(thread_pool,first,last_00);
      first = wait_for_completion(thread_pool,count);
      last = (work_item *)0x0;
      pwVar2 = first;
    }
    last_00 = pwVar2;
    pwVar2 = (work_item *)range->end;
  }
  __assert_fail("current_task",
                "/workspace/llm4binary/github/license_all_cmakelists_25/madmann91[P]rt/src/core/thread_pool.c"
                ,0x108,
                "void parallel_for_1d(struct thread_pool *, void (*)(struct parallel_task_1d *, size_t), struct parallel_task_1d *, size_t, const struct range *)"
               );
}

Assistant:

void parallel_for_1d(
    struct thread_pool* thread_pool,
    void (*compute)(struct parallel_task_1d*, size_t),
    struct parallel_task_1d* init, size_t task_size,
    const struct range* range)
{
    size_t thread_count = get_thread_count(thread_pool);
    size_t task_count = thread_count * 2;
    struct work_item* tasks = xmalloc(task_size * task_count);
    init_parallel_tasks(tasks, &init->work_item, (work_fn_t)compute, task_size, task_count);

    struct work_item* current_task  = tasks;
    struct work_item* first_task    = tasks;
    struct work_item* previous_task = NULL;

    const size_t chunk_size = compute_chunk_size(range[0].end - range[0].begin, task_count);
    for (size_t i = range[0].begin; i < range[0].end; i += chunk_size) {
        assert(current_task);
        ((struct parallel_task_1d*)current_task)->range.begin = i;
        ((struct parallel_task_1d*)current_task)->range.end   = range_end(i, chunk_size, range[0].end);
        previous_task = current_task;
        current_task = current_task->next;
        if (!current_task) {
            submit_work(thread_pool, first_task, previous_task);
            first_task = current_task = wait_for_completion(thread_pool, thread_count);
            previous_task = NULL;
        }
    }
    if (previous_task) {
        previous_task->next = NULL;
        submit_work(thread_pool, first_task, previous_task);
    }
    wait_for_completion(thread_pool, 0);
    free(tasks);
}